

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O3

int ext_loader_impl_discover(loader_impl impl,loader_handle handle,context ctx)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long *plVar6;
  loader_impl_ext_handle_lib_type ext;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  plVar6 = *handle;
  plVar1 = *(long **)((long)handle + 8);
  if (plVar6 == plVar1) {
    uVar4 = 0;
  }
  else {
    do {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>((string *)local_60,*plVar6,plVar6[1] + *plVar6);
      local_40 = (undefined4)plVar6[4];
      uStack_3c = *(undefined4 *)((long)plVar6 + 0x24);
      uStack_38 = (undefined4)plVar6[5];
      uStack_34 = *(undefined4 *)((long)plVar6 + 0x2c);
      pcVar2 = (code *)plVar6[5];
      uVar5 = loader_impl_handle_container_of(impl,handle);
      iVar3 = (*pcVar2)(impl,uVar5);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
    } while ((iVar3 == 0) && (plVar6 = plVar6 + 6, plVar6 != plVar1));
    uVar4 = (uint)(iVar3 != 0);
  }
  return uVar4;
}

Assistant:

int ext_loader_impl_discover(loader_impl impl, loader_handle handle, context ctx)
{
	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	(void)ctx; /* We have opted by pass the handle instead of the context of the handle */

	for (auto ext : ext_handle->extensions)
	{
		loader_impl_function_cast function_cast;

		function_cast.ptr = ext.addr;

		if (function_cast.fn(impl, loader_impl_handle_container_of(impl, handle)) != 0)
		{
			return 1;
		}
	}

	return 0;
}